

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_ls.c
# Opt level: O0

int idaLsBandDQJac(sunrealtype tt,sunrealtype c_j,N_Vector yy,N_Vector yp,N_Vector rr,SUNMatrix Jac,
                  IDAMem IDA_mem,N_Vector tmp1,N_Vector tmp2,N_Vector tmp3)

{
  double dVar1;
  double dVar2;
  long lVar3;
  int iVar4;
  sunindextype sVar5;
  sunindextype sVar6;
  sunindextype sVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  sunrealtype *psVar16;
  SUNMatrix in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  long in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  double in_XMM1_Qa;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  int retval;
  IDALsMem idals_mem;
  sunindextype mlower;
  sunindextype mupper;
  sunindextype N;
  sunindextype group;
  sunindextype ngroups;
  sunindextype width;
  sunindextype i2;
  sunindextype i1;
  sunindextype j;
  sunindextype i;
  N_Vector yptemp;
  N_Vector ytemp;
  N_Vector rtemp;
  sunrealtype *col_j;
  sunrealtype *r_data;
  sunrealtype *rtemp_data;
  sunrealtype *yptemp_data;
  sunrealtype *ytemp_data;
  sunrealtype *cns_data;
  sunrealtype *ewt_data;
  sunrealtype *yp_data;
  sunrealtype *y_data;
  sunrealtype ewtj;
  sunrealtype conj;
  sunrealtype srur;
  sunrealtype ypj;
  sunrealtype yj;
  sunrealtype inc_inv;
  sunrealtype inc;
  long local_1a8;
  long local_1a0;
  double local_198;
  double local_190;
  double local_180;
  double local_170;
  double local_168;
  double local_158;
  long local_148;
  double local_140;
  long local_110;
  long local_e8;
  long local_e0;
  long local_98;
  double local_48;
  
  local_98 = 0;
  lVar3 = *(long *)(in_R8 + 0x418);
  sVar5 = SUNBandMatrix_Columns(in_RCX);
  sVar6 = SUNBandMatrix_UpperBandwidth(in_RCX);
  sVar7 = SUNBandMatrix_LowerBandwidth(in_RCX);
  lVar8 = N_VGetArrayPointer(*(undefined8 *)(in_R8 + 0x180));
  lVar9 = N_VGetArrayPointer(in_RDX);
  lVar10 = N_VGetArrayPointer(in_RDI);
  lVar11 = N_VGetArrayPointer(in_RSI);
  lVar12 = N_VGetArrayPointer(in_R9);
  lVar13 = N_VGetArrayPointer(in_stack_00000008);
  lVar14 = N_VGetArrayPointer(in_stack_00000010);
  if (*(int *)(in_R8 + 0x58) != 0) {
    local_98 = N_VGetArrayPointer(*(undefined8 *)(in_R8 + 0x1b8));
  }
  N_VScale(0x3ff0000000000000,in_RDI,in_stack_00000008);
  N_VScale(0x3ff0000000000000,in_RSI,in_stack_00000010);
  if (0.0 < *(double *)(in_R8 + 8)) {
    local_140 = sqrt(*(double *)(in_R8 + 8));
  }
  else {
    local_140 = 0.0;
  }
  lVar15 = sVar7 + sVar6 + 1;
  local_148 = sVar5;
  if (lVar15 < sVar5) {
    local_148 = lVar15;
  }
  local_110 = 1;
  while( true ) {
    if (local_148 < local_110) {
      return 0;
    }
    for (local_e8 = local_110 + -1; local_e8 < sVar5; local_e8 = lVar15 + local_e8) {
      dVar1 = *(double *)(lVar10 + local_e8 * 8);
      dVar2 = *(double *)(lVar11 + local_e8 * 8);
      local_170 = *(double *)(lVar8 + local_e8 * 8);
      if (ABS(dVar1) <= ABS(*(double *)(in_R8 + 0x290) * dVar2)) {
        local_158 = ABS(*(double *)(in_R8 + 0x290) * dVar2);
      }
      else {
        local_158 = ABS(dVar1);
      }
      if (local_140 * local_158 <= 1.0 / local_170) {
        local_170 = 1.0 / local_170;
      }
      else {
        if (ABS(dVar1) <= ABS(*(double *)(in_R8 + 0x290) * dVar2)) {
          local_168 = ABS(*(double *)(in_R8 + 0x290) * dVar2);
        }
        else {
          local_168 = ABS(dVar1);
        }
        local_170 = local_140 * local_168;
      }
      local_48 = local_170;
      if (*(double *)(in_R8 + 0x290) * dVar2 < 0.0) {
        local_48 = -local_170;
      }
      local_48 = (dVar1 + local_48) - dVar1;
      if (*(int *)(in_R8 + 0x58) != 0) {
        dVar2 = *(double *)(local_98 + local_e8 * 8);
        if ((ABS(dVar2) != 1.0) || (NAN(ABS(dVar2)))) {
          if ((ABS(dVar2) == 2.0) && ((!NAN(ABS(dVar2)) && ((dVar1 + local_48) * dVar2 <= 0.0)))) {
            local_48 = -local_48;
          }
        }
        else if ((dVar1 + local_48) * dVar2 < 0.0) {
          local_48 = -local_48;
        }
      }
      *(double *)(lVar13 + local_e8 * 8) = local_48 + *(double *)(lVar13 + local_e8 * 8);
      *(double *)(lVar14 + local_e8 * 8) =
           in_XMM1_Qa * local_48 + *(double *)(lVar14 + local_e8 * 8);
    }
    iVar4 = (**(code **)(in_R8 + 0x10))
                      (in_XMM0_Qa,in_stack_00000008,in_stack_00000010,in_R9,
                       *(undefined8 *)(in_R8 + 0x18));
    *(long *)(lVar3 + 0xa8) = *(long *)(lVar3 + 0xa8) + 1;
    if (iVar4 != 0) break;
    for (local_e8 = local_110 + -1; local_e8 < sVar5; local_e8 = lVar15 + local_e8) {
      dVar1 = *(double *)(lVar10 + local_e8 * 8);
      *(double *)(lVar13 + local_e8 * 8) = dVar1;
      dVar2 = *(double *)(lVar11 + local_e8 * 8);
      *(double *)(lVar14 + local_e8 * 8) = dVar2;
      psVar16 = SUNBandMatrix_Column(in_RCX,local_e8);
      local_198 = *(double *)(lVar8 + local_e8 * 8);
      if (ABS(dVar1) <= ABS(*(double *)(in_R8 + 0x290) * dVar2)) {
        local_180 = ABS(*(double *)(in_R8 + 0x290) * dVar2);
      }
      else {
        local_180 = ABS(dVar1);
      }
      if (local_140 * local_180 <= 1.0 / local_198) {
        local_198 = 1.0 / local_198;
      }
      else {
        if (ABS(dVar1) <= ABS(*(double *)(in_R8 + 0x290) * dVar2)) {
          local_190 = ABS(*(double *)(in_R8 + 0x290) * dVar2);
        }
        else {
          local_190 = ABS(dVar1);
        }
        local_198 = local_140 * local_190;
      }
      local_48 = local_198;
      if (*(double *)(in_R8 + 0x290) * dVar2 < 0.0) {
        local_48 = -local_198;
      }
      local_48 = (dVar1 + local_48) - dVar1;
      if (*(int *)(in_R8 + 0x58) != 0) {
        dVar2 = *(double *)(local_98 + local_e8 * 8);
        if ((ABS(dVar2) != 1.0) || (NAN(ABS(dVar2)))) {
          if ((ABS(dVar2) == 2.0) && ((!NAN(ABS(dVar2)) && ((dVar1 + local_48) * dVar2 <= 0.0)))) {
            local_48 = -local_48;
          }
        }
        else if ((dVar1 + local_48) * dVar2 < 0.0) {
          local_48 = -local_48;
        }
      }
      if (local_e8 - sVar6 < 0) {
        local_1a0 = 0;
      }
      else {
        local_1a0 = local_e8 - sVar6;
      }
      if (local_e8 + sVar7 < sVar5 + -1) {
        local_1a8 = local_e8 + sVar7;
      }
      else {
        local_1a8 = sVar5 + -1;
      }
      for (local_e0 = local_1a0; local_e0 <= local_1a8; local_e0 = local_e0 + 1) {
        psVar16[local_e0 - local_e8] =
             (1.0 / local_48) *
             (*(double *)(lVar12 + local_e0 * 8) - *(double *)(lVar9 + local_e0 * 8));
      }
    }
    local_110 = local_110 + 1;
  }
  return iVar4;
}

Assistant:

int idaLsBandDQJac(sunrealtype tt, sunrealtype c_j, N_Vector yy, N_Vector yp,
                   N_Vector rr, SUNMatrix Jac, IDAMem IDA_mem, N_Vector tmp1,
                   N_Vector tmp2, N_Vector tmp3)
{
  sunrealtype inc, inc_inv, yj, ypj, srur, conj, ewtj;
  sunrealtype *y_data, *yp_data, *ewt_data, *cns_data = NULL;
  sunrealtype *ytemp_data, *yptemp_data, *rtemp_data, *r_data, *col_j;
  N_Vector rtemp, ytemp, yptemp;
  sunindextype i, j, i1, i2, width, ngroups, group;
  sunindextype N, mupper, mlower;
  IDALsMem idals_mem;
  int retval = 0;

  /* access LsMem interface structure */
  idals_mem = (IDALsMem)IDA_mem->ida_lmem;

  /* access matrix dimensions */
  N      = SUNBandMatrix_Columns(Jac);
  mupper = SUNBandMatrix_UpperBandwidth(Jac);
  mlower = SUNBandMatrix_LowerBandwidth(Jac);

  /* Rename work vectors for use as temporary values of r, y and yp */
  rtemp  = tmp1;
  ytemp  = tmp2;
  yptemp = tmp3;

  /* Obtain pointers to the data for all eight vectors used.  */
  ewt_data    = N_VGetArrayPointer(IDA_mem->ida_ewt);
  r_data      = N_VGetArrayPointer(rr);
  y_data      = N_VGetArrayPointer(yy);
  yp_data     = N_VGetArrayPointer(yp);
  rtemp_data  = N_VGetArrayPointer(rtemp);
  ytemp_data  = N_VGetArrayPointer(ytemp);
  yptemp_data = N_VGetArrayPointer(yptemp);
  if (IDA_mem->ida_constraintsSet)
  {
    cns_data = N_VGetArrayPointer(IDA_mem->ida_constraints);
  }

  /* Initialize ytemp and yptemp. */
  N_VScale(ONE, yy, ytemp);
  N_VScale(ONE, yp, yptemp);

  /* Compute miscellaneous values for the Jacobian computation. */
  srur    = SUNRsqrt(IDA_mem->ida_uround);
  width   = mlower + mupper + 1;
  ngroups = SUNMIN(width, N);

  /* Loop over column groups. */
  for (group = 1; group <= ngroups; group++)
  {
    /* Increment all yy[j] and yp[j] for j in this group. */
    for (j = group - 1; j < N; j += width)
    {
      yj   = y_data[j];
      ypj  = yp_data[j];
      ewtj = ewt_data[j];

      /* Set increment inc to yj based on sqrt(uround)*abs(yj), with
        adjustments using ypj and ewtj if this is small, and a further
        adjustment to give it the same sign as hh*ypj. */
      inc = SUNMAX(srur * SUNMAX(SUNRabs(yj), SUNRabs(IDA_mem->ida_hh * ypj)),
                   ONE / ewtj);
      if (IDA_mem->ida_hh * ypj < ZERO) { inc = -inc; }
      inc = (yj + inc) - yj;

      /* Adjust sign(inc) again if yj has an inequality constraint. */
      if (IDA_mem->ida_constraintsSet)
      {
        conj = cns_data[j];
        if (SUNRabs(conj) == ONE)
        {
          if ((yj + inc) * conj < ZERO) { inc = -inc; }
        }
        else if (SUNRabs(conj) == TWO)
        {
          if ((yj + inc) * conj <= ZERO) { inc = -inc; }
        }
      }

      /* Increment yj and ypj. */
      ytemp_data[j] += inc;
      yptemp_data[j] += c_j * inc;
    }

    /* Call res routine with incremented arguments. */
    retval = IDA_mem->ida_res(tt, ytemp, yptemp, rtemp, IDA_mem->ida_user_data);
    idals_mem->nreDQ++;
    if (retval != 0) { break; }

    /* Loop over the indices j in this group again. */
    for (j = group - 1; j < N; j += width)
    {
      /* Reset ytemp and yptemp components that were perturbed. */
      yj = ytemp_data[j] = y_data[j];
      ypj = yptemp_data[j] = yp_data[j];
      col_j                = SUNBandMatrix_Column(Jac, j);
      ewtj                 = ewt_data[j];

      /* Set increment inc exactly as above. */
      inc = SUNMAX(srur * SUNMAX(SUNRabs(yj), SUNRabs(IDA_mem->ida_hh * ypj)),
                   ONE / ewtj);
      if (IDA_mem->ida_hh * ypj < ZERO) { inc = -inc; }
      inc = (yj + inc) - yj;
      if (IDA_mem->ida_constraintsSet)
      {
        conj = cns_data[j];
        if (SUNRabs(conj) == ONE)
        {
          if ((yj + inc) * conj < ZERO) { inc = -inc; }
        }
        else if (SUNRabs(conj) == TWO)
        {
          if ((yj + inc) * conj <= ZERO) { inc = -inc; }
        }
      }

      /* Load the difference quotient Jacobian elements for column j */
      inc_inv = ONE / inc;
      i1      = SUNMAX(0, j - mupper);
      i2      = SUNMIN(j + mlower, N - 1);
      for (i = i1; i <= i2; i++)
      {
        SM_COLUMN_ELEMENT_B(col_j, i, j) = inc_inv * (rtemp_data[i] - r_data[i]);
      }
    }
  }

  return (retval);
}